

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

int amqpvalue_get_short(AMQP_VALUE value,int16_t *short_value)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l_1;
  AMQP_VALUE_DATA *value_data;
  LOGGER_LOG l;
  int result;
  int16_t *short_value_local;
  AMQP_VALUE value_local;
  
  if ((value == (AMQP_VALUE)0x0) || (short_value == (int16_t *)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_get_short",0x235,1,"Bad arguments: value = %p, short_value = %p",value,
                short_value);
    }
    l._4_4_ = 0x236;
  }
  else if (value->type == AMQP_TYPE_SHORT) {
    *short_value = (value->value).ushort_value;
    l._4_4_ = 0;
  }
  else {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_get_short",0x23e,1,"Value is not of type SHORT");
    }
    l._4_4_ = 0x23f;
  }
  return l._4_4_;
}

Assistant:

int amqpvalue_get_short(AMQP_VALUE value, int16_t* short_value)
{
    int result;

    /* Codes_SRS_AMQPVALUE_01_065: [If any of the arguments is NULL then amqpvalue_get_short shall return a non-zero value.] */
    if ((value == NULL) ||
        (short_value == NULL))
    {
        LogError("Bad arguments: value = %p, short_value = %p",
            value, short_value);
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)value;
        /* Codes_SRS_AMQPVALUE_01_066: [If the type of the value is not short (was not created with amqpvalue_create_short), then amqpvalue_get_short shall return a non-zero value.] */
        if (value_data->type != AMQP_TYPE_SHORT)
        {
            LogError("Value is not of type SHORT");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_063: [amqpvalue_get_short shall fill in the short_value argument the int16_t value stored by the AMQP value indicated by the value argument.] */
            *short_value = value_data->value.short_value;

            /* Codes_SRS_AMQPVALUE_01_064: [On success amqpvalue_get_short shall return 0.] */
            result = 0;
        }
    }

    return result;
}